

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::peer_blocked_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_blocked_alert *this)

{
  size_t sVar1;
  char ret [600];
  string local_298;
  char local_278 [608];
  
  peer_alert::message_abi_cxx11_(&local_298,&this->super_peer_alert);
  snprintf(local_278,600,"%s: blocked peer [%s]",local_298._M_dataplus._M_p,
           _ZZNK10libtorrent18peer_blocked_alert7messageB5cxx11EvE10reason_str_rel +
           *(int *)(_ZZNK10libtorrent18peer_blocked_alert7messageB5cxx11EvE10reason_str_rel +
                   (long)*(int *)&(this->super_peer_alert).field_0x9c * 4));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278,local_278 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_blocked_alert::message() const
	{
		char ret[600];
		static char const* const reason_str[] =
		{
			"ip_filter",
			"port_filter",
			"i2p_mixed",
			"privileged_ports",
			"utp_disabled",
			"tcp_disabled",
			"invalid_local_interface"
		};

		std::snprintf(ret, sizeof(ret), "%s: blocked peer [%s]"
			, peer_alert::message().c_str(), reason_str[reason]);
		return ret;
	}